

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmt_helper.h
# Opt level: O0

void spdlog::details::fmt_helper::pad2(int n,memory_buf_t *dest)

{
  format_args args;
  back_insert_iterator<fmt::v11::basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_>_>
  *in_RSI;
  int in_EDI;
  basic_string_view<char> bVar1;
  int unused;
  string_view sv;
  basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_> *in_stack_fffffffffffffea8;
  buffer<char> *in_stack_fffffffffffffeb0;
  basic_string_view<char> *pbVar2;
  anon_class_1_0_00000001 *in_stack_fffffffffffffec0;
  basic_string_view<char> local_138;
  basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_> *local_128;
  undefined6 in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee6;
  undefined1 in_stack_fffffffffffffee7;
  undefined4 in_stack_fffffffffffffef0;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_stack_fffffffffffffef8;
  string_view in_stack_ffffffffffffff00;
  undefined8 uVar3;
  format_string_checker<char,_1,_0,_false> local_90;
  char *local_50;
  size_t local_48;
  int local_40 [2];
  basic_string_view<char> local_38;
  undefined1 *local_20;
  basic_string_view<char> *local_18;
  undefined1 *local_10;
  undefined1 *local_8;
  
  if ((in_EDI < 0) || (99 < in_EDI)) {
    local_128 = (basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_> *)
                std::
                back_inserter<fmt::v11::basic_memory_buffer<char,250ul,fmt::v11::detail::allocator<char>>>
                          (in_stack_fffffffffffffea8);
    pad2::anon_class_1_0_00000001::operator()(in_stack_fffffffffffffec0);
    pbVar2 = &local_138;
    local_20 = &stack0xfffffffffffffec7;
    local_18 = pbVar2;
    bVar1 = ::fmt::v11::operator()((FMT_COMPILE_STRING *)0x25ce06);
    *pbVar2 = bVar1;
    local_38 = ::fmt::v11::operator()((FMT_COMPILE_STRING *)0x25ce22);
    local_50 = local_38.data_;
    local_48 = local_38.size_;
    ::fmt::v11::detail::format_string_checker<char,1,0,false>::format_string_checker<int&>
              (&local_90,local_38.data_,local_38.size_);
    bVar1.size_._0_4_ = in_stack_fffffffffffffef0;
    bVar1.data_ = (char *)in_RSI;
    bVar1.size_._4_4_ = in_EDI;
    ::fmt::v11::detail::
    parse_format_string<char,fmt::v11::detail::format_string_checker<char,1,0,false>>
              (bVar1,(format_string_checker<char,_1,_0,_false> *)
                     CONCAT17(in_stack_fffffffffffffee7,
                              CONCAT16(in_stack_fffffffffffffee6,in_stack_fffffffffffffee0)));
    local_40[0] = 0;
    ::fmt::v11::detail::ignore_unused<int>(local_40);
    local_8 = &stack0xffffffffffffff08;
    local_10 = &stack0xfffffffffffffef8;
    uVar3 = 1;
    args.desc_._4_4_ = in_EDI;
    args.desc_._0_4_ = in_stack_fffffffffffffef0;
    args.field_1.args_ = in_stack_fffffffffffffef8.args_;
    ::fmt::v11::
    vformat_to<std::back_insert_iterator<fmt::v11::basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_>_>_&,_0>
              (in_RSI,in_stack_ffffffffffffff00,args);
  }
  else {
    ::fmt::v11::detail::buffer<char>::push_back
              (in_stack_fffffffffffffeb0,(char *)in_stack_fffffffffffffea8);
    ::fmt::v11::detail::buffer<char>::push_back
              (in_stack_fffffffffffffeb0,(char *)in_stack_fffffffffffffea8);
  }
  return;
}

Assistant:

inline void pad2(int n, memory_buf_t &dest) {
    if (n >= 0 && n < 100)  // 0-99
    {
        dest.push_back(static_cast<char>('0' + n / 10));
        dest.push_back(static_cast<char>('0' + n % 10));
    } else  // unlikely, but just in case, let fmt deal with it
    {
        fmt_lib::format_to(std::back_inserter(dest), SPDLOG_FMT_STRING("{:02}"), n);
    }
}